

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# laser_tag.cpp
# Opt level: O1

double __thiscall
despot::LaserTag::ObsProb(LaserTag *this,OBS_TYPE obs,State *state,ACT_TYPE action)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  double dVar4;
  double local_40;
  
  if ((this->super_BaseTag).rob_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start[*(int *)(state + 0xc)] ==
      (this->super_BaseTag).opp_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start[*(int *)(state + 0xc)]) {
    if ((this->super_BaseTag).same_loc_obs_ != obs) {
      return 0.0;
    }
  }
  else if (0 < NBEAMS) {
    local_40 = 1.0;
    lVar3 = 0;
    lVar2 = 0;
    do {
      uVar1 = ~(uint)(-1L << ((byte)BITS_PER_READING & 0x3f)) &
              (uint)(obs >> ((char)lVar2 * (byte)BITS_PER_READING & 0x3f));
      dVar4 = LaserRange(this,state,(int)lVar2);
      if (dVar4 / this->unit_size_ <= (double)(int)uVar1) {
        return 0.0;
      }
      local_40 = local_40 *
                 *(double *)
                  (*(long *)(*(long *)&(this->reading_distributions_).
                                       super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start
                                       [*(int *)(state + 0xc)].
                                       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                       ._M_impl.super__Vector_impl_data + lVar3) +
                  (long)(int)uVar1 * 8);
      lVar2 = lVar2 + 1;
      lVar3 = lVar3 + 0x18;
    } while (lVar2 < NBEAMS);
    return local_40;
  }
  return 1.0;
}

Assistant:

double LaserTag::ObsProb(OBS_TYPE obs, const State& state, ACT_TYPE action) const {
	if (rob_[state.state_id] == opp_[state.state_id])
		return obs == same_loc_obs_;

	double prod = 1.0;
	for (int dir = 0; dir < NBEAMS; dir++) {
		int reading = GetReading(obs, dir);
		if (reading >= LaserRange(state, dir) / unit_size_)
			return 0;
		double prob_mass = reading_distributions_[state.state_id][dir][reading];
		prod *= prob_mass;
	}

	return prod;
}